

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerInlineeStart(Lowerer *this,Instr *inlineeStartInstr)

{
  Lowerer *pLVar1;
  code *pcVar2;
  anon_class_24_3_2dfe2441 callback;
  anon_class_32_4_2e1de3cb callback_00;
  bool bVar3;
  undefined4 *puVar4;
  Func *pFVar5;
  Instr *prev;
  undefined4 local_54;
  Opnd *pOStack_50;
  uint i;
  Instr *argInsertInstr;
  Lowerer *local_40;
  Instr **local_38;
  undefined1 local_30 [8];
  Instr *startCall;
  Opnd *linkOpnd;
  Instr *inlineeStartInstr_local;
  Lowerer *this_local;
  
  linkOpnd = (Opnd *)inlineeStartInstr;
  inlineeStartInstr_local = (Instr *)this;
  startCall = (Instr *)IR::Instr::GetSrc2(inlineeStartInstr);
  if (startCall == (Instr *)0x0) {
    if ((*(uint *)(linkOpnd[2]._vptr_Opnd + 0x48) >> 1 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3903,"(inlineeStartInstr->m_func->m_hasInlineArgsOpt)",
                         "inlineeStartInstr->m_func->m_hasInlineArgsOpt");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_local = *(Lowerer **)&linkOpnd[1].m_valueType;
  }
  else {
    if (*(int *)(linkOpnd[2]._vptr_Opnd + 0x3d) == -1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3907,"(inlineeStartInstr->m_func->firstActualStackOffset != -1)",
                         "This should have been already done in backward pass");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    argInsertInstr = (Instr *)local_30;
    local_38 = (Instr **)&linkOpnd;
    callback.this = this;
    callback.startCall = (Instr **)argInsertInstr;
    callback.inlineeStartInstr = local_38;
    local_40 = this;
    IR::Instr::IterateArgInstrs<Lowerer::LowerInlineeStart(IR::Instr*)::__0>
              ((Instr *)linkOpnd,callback);
    pOStack_50 = linkOpnd;
    local_54 = 0;
    callback_00.argInsertInstr = (Instr **)&stack0xffffffffffffffb0;
    callback_00.i = &local_54;
    callback_00.inlineeStartInstr = (Instr **)&linkOpnd;
    callback_00.this = this;
    IR::Instr::IterateMetaArgs<Lowerer::LowerInlineeStart(IR::Instr*)::__1>
              ((Instr *)linkOpnd,callback_00);
    pLVar1 = *(Lowerer **)&linkOpnd[1].m_valueType;
    this_local = pLVar1;
    if (((*(uint *)(linkOpnd[2]._vptr_Opnd + 0x48) >> 1 & 1) == 0) &&
       (pFVar5 = Func::GetParentFunc((Func *)linkOpnd[2]._vptr_Opnd),
       (*(uint *)&pFVar5->field_0x240 >> 1 & 1) == 0)) {
      IR::Instr::Remove((Instr *)linkOpnd);
    }
    else {
      IR::Instr::FreeSrc1((Instr *)linkOpnd);
      IR::Instr::FreeSrc2((Instr *)linkOpnd);
      IR::Instr::FreeDst((Instr *)linkOpnd);
    }
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
Lowerer::LowerInlineeStart(IR::Instr * inlineeStartInstr)
{
    IR::Opnd *linkOpnd   = inlineeStartInstr->GetSrc2();
    if (!linkOpnd)
    {
        Assert(inlineeStartInstr->m_func->m_hasInlineArgsOpt);
        return inlineeStartInstr->m_prev;
    }

    AssertMsg(inlineeStartInstr->m_func->firstActualStackOffset != -1, "This should have been already done in backward pass");

    IR::Instr *startCall;
    // Free the argOut links and lower them to MOVs
    inlineeStartInstr->IterateArgInstrs([&](IR::Instr* argInstr){
        Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A || argInstr->m_opcode == Js::OpCode::ArgOut_A_Inline);
        startCall = argInstr->GetSrc2()->GetStackSym()->m_instrDef;
        argInstr->FreeSrc2();
#pragma prefast(suppress:6235, "Non-Zero Constant in Condition")
        if (!PHASE_ON(Js::EliminateArgoutForInlineePhase, this->m_func) || inlineeStartInstr->m_func->GetJITFunctionBody()->HasOrParentHasArguments())
        {
            m_lowererMD.ChangeToAssign(argInstr);
        }
        else
        {
            argInstr->m_opcode = Js::OpCode::ArgOut_A_InlineBuiltIn;
        }

        return false;
    });

    IR::Instr *argInsertInstr = inlineeStartInstr;
    uint i = 0;
    inlineeStartInstr->IterateMetaArgs( [&] (IR::Instr* metaArg)
    {
        if(i == 0)
        {
            Lowerer::InsertMove(metaArg->m_func->GetNextInlineeFrameArgCountSlotOpnd(),
                IR::AddrOpnd::NewNull(metaArg->m_func),
                argInsertInstr);
        }
        if (i == Js::Constants::InlineeMetaArgIndex_FunctionObject)
        {
            metaArg->SetSrc1(inlineeStartInstr->GetSrc1());
        }
        metaArg->Unlink();
        argInsertInstr->InsertBefore(metaArg);
        IR::Instr* prev = metaArg->m_prev;
        m_lowererMD.ChangeToAssign(metaArg);
        if (i == Js::Constants::InlineeMetaArgIndex_Argc)
        {
#if defined(_M_IX86) || defined(_M_X64)
            Assert(metaArg == prev->m_next);
#else //defined(_M_ARM)
            Assert(prev->m_next->m_opcode == Js::OpCode::LDIMM);
#endif
            metaArg = prev->m_next;
            Assert(metaArg->GetSrc1()->AsIntConstOpnd()->m_dontEncode == true);
            metaArg->isInlineeEntryInstr = true;
            LowererMD::Legalize(metaArg);
        }
        argInsertInstr = metaArg;
        i++;
        return false;
    });

    IR::Instr* prev = inlineeStartInstr->m_prev;

    if (inlineeStartInstr->m_func->m_hasInlineArgsOpt || inlineeStartInstr->m_func->GetParentFunc()->m_hasInlineArgsOpt)
    {
        inlineeStartInstr->FreeSrc1();
        inlineeStartInstr->FreeSrc2();
        inlineeStartInstr->FreeDst();
    }
    else
    {
        inlineeStartInstr->Remove();
    }

    return prev;
}